

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

bool __thiscall
glcts::CreateShadProgCase::checkCSProg
          (CreateShadProgCase *this,Functions *gl,GLuint program,int expectedSep,int expectedLink)

{
  int linked;
  int separable;
  GLint local_30;
  GLint local_2c;
  
  local_2c = 0;
  local_30 = 0;
  if (program != 0) {
    (*gl->getProgramiv)(program,0x8258,&local_2c);
    (*gl->getProgramiv)(program,0x8b82,&local_30);
    if (local_2c == expectedSep) {
      return local_30 == expectedLink;
    }
  }
  return false;
}

Assistant:

bool checkCSProg(const glw::Functions& gl, GLuint program, int expectedSep = GL_TRUE, int expectedLink = GL_TRUE)
	{
		int separable = GL_FALSE;
		int linked	= GL_FALSE;
		if (program != 0)
		{
			gl.getProgramiv(program, GL_PROGRAM_SEPARABLE, &separable);
			gl.getProgramiv(program, GL_LINK_STATUS, &linked);
		}

		return (program != 0) && (separable == expectedSep) && (linked == expectedLink);
	}